

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O0

void start_pass(j_decompress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *in_RDI;
  int col;
  int row;
  FLOAT_MULT_TYPE *fmtbl;
  IFAST_MULT_TYPE *ifmtbl;
  ISLOW_MULT_TYPE *ismtbl;
  JQUANT_TBL *qtbl;
  inverse_DCT_method_ptr method_ptr;
  int method;
  jpeg_component_info *compptr;
  int i;
  int ci;
  my_idct_ptr idct;
  int local_58;
  int local_54;
  code *local_30;
  int local_24;
  long local_20;
  int local_18;
  int local_14;
  
  lVar1 = in_RDI[0x4b];
  local_24 = 0;
  local_30 = (code *)0x0;
  local_14 = 0;
  local_20 = in_RDI[0x26];
  for (; local_14 < (int)in_RDI[7]; local_14 = local_14 + 1) {
    switch(*(undefined4 *)(local_20 + 0x24)) {
    case 1:
      local_30 = jpeg_idct_1x1;
      local_24 = 0;
      break;
    case 2:
      iVar4 = jsimd_can_idct_2x2();
      if (iVar4 == 0) {
        local_30 = jpeg_idct_2x2;
      }
      else {
        local_30 = jsimd_idct_2x2;
      }
      local_24 = 0;
      break;
    case 3:
      local_30 = jpeg_idct_3x3;
      local_24 = 0;
      break;
    case 4:
      iVar4 = jsimd_can_idct_4x4();
      if (iVar4 == 0) {
        local_30 = jpeg_idct_4x4;
      }
      else {
        local_30 = jsimd_idct_4x4;
      }
      local_24 = 0;
      break;
    case 5:
      local_30 = jpeg_idct_5x5;
      local_24 = 0;
      break;
    case 6:
      local_30 = jpeg_idct_6x6;
      local_24 = 0;
      break;
    case 7:
      local_30 = jpeg_idct_7x7;
      local_24 = 0;
      break;
    case 8:
      iVar4 = (int)in_RDI[0xc];
      if (iVar4 == 0) {
        iVar4 = jsimd_can_idct_islow();
        if (iVar4 == 0) {
          local_30 = jpeg_idct_islow;
        }
        else {
          local_30 = jsimd_idct_islow;
        }
        local_24 = 0;
      }
      else if (iVar4 == 1) {
        iVar4 = jsimd_can_idct_ifast();
        if (iVar4 == 0) {
          local_30 = jpeg_idct_ifast;
        }
        else {
          local_30 = jsimd_idct_ifast;
        }
        local_24 = 1;
      }
      else if (iVar4 == 2) {
        iVar4 = jsimd_can_idct_float();
        if (iVar4 == 0) {
          local_30 = jpeg_idct_float;
        }
        else {
          local_30 = jsimd_idct_float;
        }
        local_24 = 2;
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x30;
        (**(code **)*in_RDI)(in_RDI);
      }
      break;
    case 9:
      local_30 = jpeg_idct_9x9;
      local_24 = 0;
      break;
    case 10:
      local_30 = jpeg_idct_10x10;
      local_24 = 0;
      break;
    case 0xb:
      local_30 = jpeg_idct_11x11;
      local_24 = 0;
      break;
    case 0xc:
      local_30 = jpeg_idct_12x12;
      local_24 = 0;
      break;
    case 0xd:
      local_30 = jpeg_idct_13x13;
      local_24 = 0;
      break;
    case 0xe:
      local_30 = jpeg_idct_14x14;
      local_24 = 0;
      break;
    case 0xf:
      local_30 = jpeg_idct_15x15;
      local_24 = 0;
      break;
    case 0x10:
      local_30 = jpeg_idct_16x16;
      local_24 = 0;
      break;
    default:
      *(undefined4 *)(*in_RDI + 0x28) = 7;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)(local_20 + 0x24);
      (**(code **)*in_RDI)(in_RDI);
    }
    *(code **)(lVar1 + 8 + (long)local_14 * 8) = local_30;
    if (((*(int *)(local_20 + 0x30) != 0) &&
        (*(int *)(lVar1 + 0x58 + (long)local_14 * 4) != local_24)) &&
       (lVar2 = *(long *)(local_20 + 0x50), lVar2 != 0)) {
      *(int *)(lVar1 + 0x58 + (long)local_14 * 4) = local_24;
      if (local_24 == 0) {
        lVar3 = *(long *)(local_20 + 0x58);
        for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
          *(undefined2 *)(lVar3 + (long)local_18 * 2) = *(undefined2 *)(lVar2 + (long)local_18 * 2);
        }
      }
      else if (local_24 == 1) {
        lVar3 = *(long *)(local_20 + 0x58);
        for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
          *(short *)(lVar3 + (long)local_18 * 2) =
               (short)((long)((ulong)*(ushort *)(lVar2 + (long)local_18 * 2) *
                              (long)start_pass::aanscales[local_18] + 0x800) >> 0xc);
        }
      }
      else if (local_24 == 2) {
        lVar3 = *(long *)(local_20 + 0x58);
        local_18 = 0;
        for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
          for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
            *(float *)(lVar3 + (long)local_18 * 4) =
                 (float)((double)*(ushort *)(lVar2 + (long)local_18 * 2) *
                         start_pass::aanscalefactor[local_54] * start_pass::aanscalefactor[local_58]
                        );
            local_18 = local_18 + 1;
          }
        }
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x30;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    local_20 = local_20 + 0x60;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass(j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr)cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL *qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch (compptr->_DCT_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case 1:
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;      /* jidctred uses islow-style table */
      break;
    case 2:
      if (jsimd_can_idct_2x2())
        method_ptr = jsimd_idct_2x2;
      else
        method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;      /* jidctred uses islow-style table */
      break;
    case 3:
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 4:
      if (jsimd_can_idct_4x4())
        method_ptr = jsimd_idct_4x4;
      else
        method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;      /* jidctred uses islow-style table */
      break;
    case 5:
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 6:
#if defined(__mips__)
      if (jsimd_can_idct_6x6())
        method_ptr = jsimd_idct_6x6;
      else
#endif
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 7:
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
#endif
    case DCTSIZE:
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
        if (jsimd_can_idct_islow())
          method_ptr = jsimd_idct_islow;
        else
          method_ptr = jpeg_idct_islow;
        method = JDCT_ISLOW;
        break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
        if (jsimd_can_idct_ifast())
          method_ptr = jsimd_idct_ifast;
        else
          method_ptr = jpeg_idct_ifast;
        method = JDCT_IFAST;
        break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
        if (jsimd_can_idct_float())
          method_ptr = jsimd_idct_float;
        else
          method_ptr = jpeg_idct_float;
        method = JDCT_FLOAT;
        break;
#endif
      default:
        ERREXIT(cinfo, JERR_NOT_COMPILED);
        break;
      }
      break;
#ifdef IDCT_SCALING_SUPPORTED
    case 9:
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 10:
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 11:
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 12:
#if defined(__mips__)
      if (jsimd_can_idct_12x12())
        method_ptr = jsimd_idct_12x12;
      else
#endif
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 13:
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 14:
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 15:
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
    case 16:
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;      /* jidctint uses islow-style table */
      break;
#endif
    default:
      ERREXIT1(cinfo, JERR_BAD_DCTSIZE, compptr->_DCT_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (!compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)           /* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
        /* For LL&M IDCT method, multipliers are equal to raw quantization
         * coefficients, but are stored as ints to ensure access efficiency.
         */
        ISLOW_MULT_TYPE *ismtbl = (ISLOW_MULT_TYPE *)compptr->dct_table;
        for (i = 0; i < DCTSIZE2; i++) {
          ismtbl[i] = (ISLOW_MULT_TYPE)qtbl->quantval[i];
        }
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
        /* For AA&N IDCT method, multipliers are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         * For integer operation, the multiplier table is to be scaled by
         * IFAST_SCALE_BITS.
         */
        IFAST_MULT_TYPE *ifmtbl = (IFAST_MULT_TYPE *)compptr->dct_table;
#define CONST_BITS  14
        static const INT16 aanscales[DCTSIZE2] = {
          /* precomputed values scaled up by 14 bits */
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
          21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
          19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
           8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
           4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
        };
        SHIFT_TEMPS

        for (i = 0; i < DCTSIZE2; i++) {
          ifmtbl[i] = (IFAST_MULT_TYPE)
            DESCALE(MULTIPLY16V16((JLONG)qtbl->quantval[i],
                                  (JLONG)aanscales[i]),
                    CONST_BITS - IFAST_SCALE_BITS);
        }
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
        /* For float AA&N IDCT method, multipliers are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         */
        FLOAT_MULT_TYPE *fmtbl = (FLOAT_MULT_TYPE *)compptr->dct_table;
        int row, col;
        static const double aanscalefactor[DCTSIZE] = {
          1.0, 1.387039845, 1.306562965, 1.175875602,
          1.0, 0.785694958, 0.541196100, 0.275899379
        };

        i = 0;
        for (row = 0; row < DCTSIZE; row++) {
          for (col = 0; col < DCTSIZE; col++) {
            fmtbl[i] = (FLOAT_MULT_TYPE)
              ((double)qtbl->quantval[i] *
               aanscalefactor[row] * aanscalefactor[col]);
            i++;
          }
        }
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}